

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSyncTests.cpp
# Opt level: O3

IterateResult __thiscall deqp::egl::anon_unknown_0::DestroySyncTest::iterate(DestroySyncTest *this)

{
  ostringstream *poVar1;
  EGLenum EVar2;
  TestLog *pTVar3;
  int iVar4;
  deUint32 dVar5;
  Library *pLVar6;
  undefined4 extraout_var;
  size_t sVar7;
  char *pcVar8;
  char *__s;
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  
  pLVar6 = EglTestContext::getLibrary((this->super_SyncTest).super_TestCase.m_eglTestCtx);
  pTVar3 = ((this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar4 = (*pLVar6->_vptr_Library[0x11])
                    (pLVar6,(this->super_SyncTest).m_eglDisplay,
                     (ulong)(this->super_SyncTest).m_syncType,0);
  (this->super_SyncTest).m_sync = (EGLSyncKHR)CONCAT44(extraout_var,iVar4);
  poVar1 = (ostringstream *)(local_1a8 + 8);
  local_1a8._0_8_ = pTVar3;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"eglCreateSyncKHR(",0x11);
  std::ostream::_M_insert<void_const*>(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  EVar2 = (this->super_SyncTest).m_syncType;
  pcVar8 = "<Unknown>";
  if (EVar2 == 0x30fa) {
    pcVar8 = "EGL_SYNC_REUSABLE_KHR";
  }
  __s = "EGL_SYNC_FENCE_KHR";
  if (EVar2 != 0x30f9) {
    __s = pcVar8;
  }
  sVar7 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,__s,sVar7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", NULL)",7);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_130);
  dVar5 = (*pLVar6->_vptr_Library[0x1f])(pLVar6);
  eglu::checkError(dVar5,"eglCreateSyncKHR()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                   ,0x3d2);
  poVar1 = (ostringstream *)(local_1a8 + 8);
  local_1a8._0_8_ = pTVar3;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"eglDestroySyncKHR(",0x12);
  std::ostream::_M_insert<void_const*>(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  std::ostream::_M_insert<void_const*>(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_130);
  (*pLVar6->_vptr_Library[0x18])
            (pLVar6,(this->super_SyncTest).m_eglDisplay,(this->super_SyncTest).m_sync);
  dVar5 = (*pLVar6->_vptr_Library[0x1f])(pLVar6);
  eglu::checkError(dVar5,"destroySyncKHR(m_eglDisplay, m_sync)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                   ,0x3d5);
  (this->super_SyncTest).m_sync = (EGLSyncKHR)0x0;
  tcu::TestContext::setTestResult
            ((this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             QP_TEST_RESULT_PASS,"Pass");
  return STOP;
}

Assistant:

IterateResult	iterate			(void)
	{
		const Library&	egl		= m_eglTestCtx.getLibrary();
		TestLog&		log		= m_testCtx.getLog();

		m_sync = egl.createSyncKHR(m_eglDisplay, m_syncType, NULL);
		log << TestLog::Message << "eglCreateSyncKHR(" << m_eglDisplay << ", " << getSyncTypeName(m_syncType) << ", NULL)" << TestLog::EndMessage;
		EGLU_CHECK_MSG(egl, "eglCreateSyncKHR()");

		log << TestLog::Message << "eglDestroySyncKHR(" << m_eglDisplay << ", " << m_sync << ")" << TestLog::EndMessage;
		EGLU_CHECK_CALL(egl, destroySyncKHR(m_eglDisplay, m_sync));
		m_sync = EGL_NO_SYNC_KHR;

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}